

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemFinalize(Mem *pMem,FuncDef *pFunc)

{
  Mem t;
  sqlite3_context ctx;
  MemValue local_88;
  undefined8 uStack_80;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  sqlite3 *psStack_60;
  _func_void_void_ptr *local_58;
  sqlite3_context local_48;
  
  local_48.isError = 0;
  if ((pFunc != (FuncDef *)0x0) &&
     (local_48.isError = 0, pFunc->xFinalize != (_func_void_sqlite3_context_ptr *)0x0)) {
    local_48.pOut = (Mem *)&local_88;
    local_48.pVdbe = (Vdbe *)0x0;
    local_48.iOp = 0;
    local_48.isError = 0;
    local_48.skipFlag = '\0';
    local_48.fErrorOrAux = '\0';
    local_48.argc = '\0';
    local_48._43_5_ = 0;
    local_48.argv[0] = (sqlite3_value *)0x0;
    local_88.r = 0.0;
    local_78 = (char *)0x0;
    pcStack_70 = (char *)0x0;
    local_68 = 0;
    local_58 = (_func_void_void_ptr *)0x0;
    uStack_80 = 1;
    psStack_60 = pMem->db;
    local_48.pFunc = pFunc;
    local_48.pMem = pMem;
    (*pFunc->xFinalize)(&local_48);
    if (0 < pMem->szMalloc) {
      sqlite3DbFree(pMem->db,pMem->zMalloc);
    }
    pMem->xDel = local_58;
    pMem->szMalloc = (undefined4)local_68;
    pMem->uTemp = local_68._4_4_;
    pMem->db = psStack_60;
    pMem->z = local_78;
    pMem->zMalloc = pcStack_70;
    (pMem->u).r = (double)local_88;
    pMem->flags = (undefined2)uStack_80;
    pMem->enc = uStack_80._2_1_;
    pMem->eSubtype = uStack_80._3_1_;
    pMem->n = uStack_80._4_4_;
  }
  return local_48.isError;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFinalize(Mem *pMem, FuncDef *pFunc){
  int rc = SQLITE_OK;
  if( ALWAYS(pFunc && pFunc->xFinalize) ){
    sqlite3_context ctx;
    Mem t;
    assert( (pMem->flags & MEM_Null)!=0 || pFunc==pMem->u.pDef );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    memset(&ctx, 0, sizeof(ctx));
    memset(&t, 0, sizeof(t));
    t.flags = MEM_Null;
    t.db = pMem->db;
    ctx.pOut = &t;
    ctx.pMem = pMem;
    ctx.pFunc = pFunc;
    pFunc->xFinalize(&ctx); /* IMP: R-24505-23230 */
    assert( (pMem->flags & MEM_Dyn)==0 );
    if( pMem->szMalloc>0 ) sqlite3DbFree(pMem->db, pMem->zMalloc);
    memcpy(pMem, &t, sizeof(t));
    rc = ctx.isError;
  }
  return rc;
}